

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O2

void test_compat_zip_3(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *a;
  char *pcVar4;
  int64_t iVar5;
  size_t s;
  archive_entry *ae;
  
  extract_reference_file("test_compat_zip_3.zip");
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'r',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_compat_zip_3.zip",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'u',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
             ,L'y',"soapui-4.0.0/","\"soapui-4.0.0/\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  iVar5 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'z',0,"0",iVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_size_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'{',wVar2,"archive_entry_size_is_set(ae)",(void *)0x0);
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'|',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  iVar1 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
             ,L'\x80',"soapui-4.0.0/soapui-settings.xml","\"soapui-4.0.0/soapui-settings.xml\"",
             pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x81',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                      (void *)0x0);
  iVar5 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x82',0x406,"1030",iVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_size_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                   ,L'\x83',wVar2,"archive_entry_size_is_set(ae)",(void *)0x0);
  archive_entry_set_pathname(ae,"test_3.txt");
  iVar1 = archive_read_extract(a,ae,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_extract(a, ae, 0)",a);
  pcVar4 = slurpfile(&s,"test_3.txt");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x8d',s,"s",0x406,"1030",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x8e',pcVar4,"p","<?xml versio","\"<?xml versio\"",0xc,"12",(void *)0x0);
  free(pcVar4);
  iVar1 = archive_read_next_header(a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x93',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_3)
{
	const char *refname = "test_compat_zip_3.zip";
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 10240));

	/* First entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("soapui-4.0.0/", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));

	/* Second entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("soapui-4.0.0/soapui-settings.xml", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(1030, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));

	/* Extract under a different name. */
	archive_entry_set_pathname(ae, "test_3.txt");
	if(libz_enabled) {
		char *p;
		size_t s;
		assertEqualIntA(a, ARCHIVE_OK, archive_read_extract(a, ae, 0));
		/* Verify the first 12 bytes actually got written to disk correctly. */
		p = slurpfile(&s, "test_3.txt");
		assertEqualInt(s, 1030);
		assertEqualMem(p, "<?xml versio", 12);
		free(p);
	} else {
		skipping("Skipping ZIP compression check, no libz support");
	}
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}